

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_enum.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::objectivec::EnumGenerator::EnumGenerator
          (EnumGenerator *this,EnumDescriptor *descriptor)

{
  _Rb_tree_header *p_Var1;
  pointer *pppEVar2;
  iterator iVar3;
  EnumValueDescriptor *pEVar4;
  iterator iVar5;
  EnumDescriptor *in_RDX;
  EnumValueDescriptor *descriptor_00;
  EnumValueDescriptor *extraout_RDX;
  EnumDescriptor *this_00;
  long lVar6;
  long lVar7;
  EnumValueDescriptor *value;
  string value_name;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  value_names;
  objectivec *local_a0;
  vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
  *local_98;
  vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
  *local_90;
  _Rb_tree<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*,std::_Identity<google::protobuf::EnumValueDescriptor_const*>,std::less<google::protobuf::EnumValueDescriptor_const*>,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
  *local_88;
  string local_80;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  this->descriptor_ = descriptor;
  local_98 = (vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
              *)&this->base_values_;
  local_90 = (vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
              *)&this->all_values_;
  local_88 = (_Rb_tree<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*,std::_Identity<google::protobuf::EnumValueDescriptor_const*>,std::less<google::protobuf::EnumValueDescriptor_const*>,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
              *)&this->alias_values_to_skip_;
  p_Var1 = &(this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header;
  (this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->base_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->base_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->base_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->all_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->all_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->all_values_).
  super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->alias_values_to_skip_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  EnumName_abi_cxx11_(&this->name_,(objectivec *)descriptor,in_RDX);
  local_60._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_60._M_impl.super__Rb_tree_header._M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  this_00 = this->descriptor_;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right =
       local_60._M_impl.super__Rb_tree_header._M_header._M_left;
  if (0 < *(int *)(this_00 + 4)) {
    lVar7 = 0;
    lVar6 = 0;
    do {
      local_a0 = (objectivec *)(*(long *)(this_00 + 0x28) + lVar7);
      pEVar4 = EnumDescriptor::FindValueByNumber
                         (this_00,*(int *)(*(long *)(this_00 + 0x28) + 4 + lVar7));
      if (local_a0 == (objectivec *)pEVar4) {
        iVar3._M_current =
             (this->base_values_).
             super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->base_values_).
            super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
          ::_M_realloc_insert<google::protobuf::EnumValueDescriptor_const*const&>
                    (local_98,iVar3,(EnumValueDescriptor **)&local_a0);
          pEVar4 = extraout_RDX;
        }
        else {
          *iVar3._M_current = (EnumValueDescriptor *)local_a0;
          pppEVar2 = &(this->base_values_).
                      super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
          *pppEVar2 = *pppEVar2 + 1;
          pEVar4 = descriptor_00;
        }
        EnumValueName_abi_cxx11_(&local_80,local_a0,pEVar4);
        std::
        _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::_M_insert_unique<std::__cxx11::string>
                  ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)&local_60,&local_80);
      }
      else {
        EnumValueName_abi_cxx11_(&local_80,local_a0,descriptor_00);
        iVar5 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_60,&local_80);
        if ((_Rb_tree_header *)iVar5._M_node == &local_60._M_impl.super__Rb_tree_header) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&local_60,&local_80);
        }
        else {
          std::
          _Rb_tree<google::protobuf::EnumValueDescriptor_const*,google::protobuf::EnumValueDescriptor_const*,std::_Identity<google::protobuf::EnumValueDescriptor_const*>,std::less<google::protobuf::EnumValueDescriptor_const*>,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
          ::_M_insert_unique<google::protobuf::EnumValueDescriptor_const*const&>
                    (local_88,(EnumValueDescriptor **)&local_a0);
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80._M_dataplus._M_p != &local_80.field_2) {
        operator_delete(local_80._M_dataplus._M_p);
      }
      iVar3._M_current =
           (this->all_values_).
           super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (iVar3._M_current ==
          (this->all_values_).
          super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<google::protobuf::EnumValueDescriptor_const*,std::allocator<google::protobuf::EnumValueDescriptor_const*>>
        ::_M_realloc_insert<google::protobuf::EnumValueDescriptor_const*const&>
                  (local_90,iVar3,(EnumValueDescriptor **)&local_a0);
      }
      else {
        *iVar3._M_current = (EnumValueDescriptor *)local_a0;
        pppEVar2 = &(this->all_values_).
                    super__Vector_base<const_google::protobuf::EnumValueDescriptor_*,_std::allocator<const_google::protobuf::EnumValueDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppEVar2 = *pppEVar2 + 1;
      }
      lVar6 = lVar6 + 1;
      this_00 = this->descriptor_;
      lVar7 = lVar7 + 0x20;
    } while (lVar6 < *(int *)(this_00 + 4));
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

EnumGenerator::EnumGenerator(const EnumDescriptor* descriptor)
    : descriptor_(descriptor),
      name_(EnumName(descriptor_)) {
  // Track the names for the enum values, and if an alias overlaps a base
  // value, skip making a name for it. Likewise if two alias overlap, the
  // first one wins.
  // The one gap in this logic is if two base values overlap, but for that
  // to happen you have to have "Foo" and "FOO" or "FOO_BAR" and "FooBar",
  // and if an enum has that, it is already going to be confusing and a
  // compile error is just fine.
  // The values are still tracked to support the reflection apis and
  // TextFormat handing since they are different there.
  std::set<std::string> value_names;

  for (int i = 0; i < descriptor_->value_count(); i++) {
    const EnumValueDescriptor* value = descriptor_->value(i);
    const EnumValueDescriptor* canonical_value =
        descriptor_->FindValueByNumber(value->number());

    if (value == canonical_value) {
      base_values_.push_back(value);
      value_names.insert(EnumValueName(value));
    } else {
      std::string value_name(EnumValueName(value));
      if (value_names.find(value_name) != value_names.end()) {
        alias_values_to_skip_.insert(value);
      } else {
        value_names.insert(value_name);
      }
    }
    all_values_.push_back(value);
  }
}